

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.h
# Opt level: O2

RegSlot __thiscall Js::AsmJsFunc::GetConstRegister<int>(AsmJsFunc *this,int val)

{
  RegSlot RVar1;
  AsmJsRegisterSpace<int> *this_00;
  
  this_00 = GetRegisterSpace<int>(this);
  RVar1 = AsmJsRegisterSpace<int>::GetConstRegister(this_00,val);
  return RVar1;
}

Assistant:

inline void AddConst             ( T val ){GetRegisterSpace<T>().AddConst( val );}